

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

void google::protobuf::anon_unknown_21::ValidateFeatureLifetimesImpl
               (Edition edition,Message *message,ValidationResults *results)

{
  pointer this;
  bool bVar1;
  CppType CVar2;
  Reflection *pRVar3;
  reference ppFVar4;
  Message *message_00;
  EnumDescriptor *pEVar5;
  EnumValueOptions *this_00;
  FieldOptions_FeatureSupport *pFVar6;
  FieldOptions *this_01;
  ValidationResults *in_R9;
  string_view sVar7;
  string_view sVar8;
  char *local_170;
  AlphaNum local_168;
  AlphaNum local_138;
  string_view local_108;
  AlphaNum local_f8;
  AlphaNum local_c8;
  string local_98;
  EnumValueDescriptor *local_78;
  EnumValueDescriptor *value;
  FieldDescriptor *pFStack_68;
  int number;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_38 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  ValidationResults *results_local;
  Message *message_local;
  Edition edition_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_38);
  pRVar3 = Message::GetReflection(message);
  Reflection::ListFields
            (pRVar3,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_38);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_38);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_38);
      return;
    }
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    pFStack_68 = *ppFVar4;
    bVar1 = FieldDescriptor::is_extension(pFStack_68);
    if (bVar1) {
      CVar2 = FieldDescriptor::cpp_type(pFStack_68);
      if (CVar2 != CPPTYPE_MESSAGE) goto LAB_002ee364;
      pRVar3 = Message::GetReflection(message);
      message_00 = Reflection::GetMessage(pRVar3,message,pFStack_68,(MessageFactory *)0x0);
      ValidateFeatureLifetimesImpl
                (edition,message_00,
                 (ValidationResults *)
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
LAB_002ee364:
      pEVar5 = FieldDescriptor::enum_type(pFStack_68);
      if (pEVar5 != (EnumDescriptor *)0x0) {
        pRVar3 = Message::GetReflection(message);
        value._4_4_ = Reflection::GetEnumValue(pRVar3,message,pFStack_68);
        pEVar5 = FieldDescriptor::enum_type(pFStack_68);
        local_78 = EnumDescriptor::FindValueByNumber(pEVar5,value._4_4_);
        this = fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_78 == (EnumValueDescriptor *)0x0) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,"Feature ");
          sVar7 = FieldDescriptor::full_name(pFStack_68);
          local_108 = sVar7;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,sVar7);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_138," has no known value ");
          absl::lts_20250127::AlphaNum::AlphaNum(&local_168,value._4_4_);
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_98,(lts_20250127 *)&local_c8,&local_f8,&local_138,&local_168,
                     (AlphaNum *)in_R9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                     &local_98);
          std::__cxx11::string::~string((string *)&local_98);
          goto LAB_002ee5e4;
        }
        sVar8 = EnumValueDescriptor::full_name(local_78);
        this_00 = EnumValueDescriptor::options(local_78);
        pFVar6 = EnumValueOptions::feature_support(this_00);
        local_170 = sVar8._M_str;
        sVar7._M_str = (char *)pFVar6;
        sVar7._M_len = (size_t)local_170;
        ValidateSingleFeatureLifetimes
                  ((anon_unknown_21 *)(ulong)edition,(Edition)sVar8._M_len,sVar7,
                   (FeatureSupport *)
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,in_R9);
      }
      sVar7 = FieldDescriptor::full_name(pFStack_68);
      sVar8._M_len = sVar7._M_str;
      this_01 = FieldDescriptor::options(pFStack_68);
      pFVar6 = FieldOptions::feature_support(this_01);
      sVar8._M_str = (char *)pFVar6;
      ValidateSingleFeatureLifetimes
                ((anon_unknown_21 *)(ulong)edition,(Edition)sVar7._M_len,sVar8,
                 (FeatureSupport *)
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,in_R9);
    }
LAB_002ee5e4:
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ValidateFeatureLifetimesImpl(Edition edition, const Message& message,
                                  FeatureResolver::ValidationResults& results) {
  std::vector<const FieldDescriptor*> fields;
  message.GetReflection()->ListFields(message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Recurse into message extension.
    if (field->is_extension() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      ValidateFeatureLifetimesImpl(
          edition, message.GetReflection()->GetMessage(message, field),
          results);
      continue;
    }

    if (field->enum_type() != nullptr) {
      int number = message.GetReflection()->GetEnumValue(message, field);
      auto value = field->enum_type()->FindValueByNumber(number);
      if (value == nullptr) {
        results.errors.emplace_back(absl::StrCat(
            "Feature ", field->full_name(), " has no known value ", number));
        continue;
      }
      ValidateSingleFeatureLifetimes(edition, value->full_name(),
                                     value->options().feature_support(),
                                     results);
    }

    ValidateSingleFeatureLifetimes(edition, field->full_name(),
                                   field->options().feature_support(), results);
  }
}